

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void set_to_vec(void *av)

{
  uint uVar1;
  ulong uVar2;
  AbstractVec vv;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  uVar1 = *av;
  local_30 = *(undefined8 **)((long)av + 8);
  if (local_30 == (undefined8 *)((long)av + 0x10)) {
    local_30 = &local_28;
    local_18 = *(undefined8 *)((long)av + 0x20);
    local_28 = *(undefined8 *)((long)av + 0x10);
    uStack_20 = *(undefined8 *)((long)av + 0x18);
  }
  *(undefined4 *)av = 0;
  *(undefined8 *)((long)av + 8) = 0;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    if ((void *)local_30[uVar2] != (void *)0x0) {
      vec_add_internal(av,(void *)local_30[uVar2]);
    }
  }
  free(local_30);
  return;
}

Assistant:

void set_to_vec(void *av) {
  AbstractVec *v = (AbstractVec *)av, vv;
  uint i;

  vv.n = v->n;
  vv.v = v->v;
  if (v->v == v->e) {
    memcpy(vv.e, v->e, sizeof(v->e));
    vv.v = vv.e;
  }
  v->n = 0;
  v->v = 0;
  for (i = 0; i < vv.n; i++)
    if (vv.v[i]) vec_add_internal(v, vv.v[i]);
  FREE(vv.v);
}